

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.h
# Opt level: O2

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnModuleName(BinaryReaderIR *this,string_view name)

{
  string_view in_stack_ffffffffffffffc8;
  
  if (name.size_ != 0) {
    (anonymous_namespace)::MakeDollarName_abi_cxx11_(in_stack_ffffffffffffffc8);
    std::__cxx11::string::operator=
              ((string *)&this->module_->name,(string *)&stack0xffffffffffffffd0);
    std::__cxx11::string::_M_dispose();
  }
  return (Result)Ok;
}

Assistant:

constexpr inline bool string_view::empty() const noexcept {
  return size_ == 0;
}